

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec08.c
# Opt level: O2

void If_Dec08MoveTo(word *pF,int nVars,int v,int p,int *Pla2Var,int *Var2Pla)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  word *pwVar3;
  int iVar4;
  long lVar5;
  byte bVar6;
  word *pwVar7;
  ulong uVar8;
  bool bVar9;
  ulong uVar10;
  word *pIn;
  uint uVar11;
  undefined1 auVar12 [16];
  word pG [16];
  
  iVar4 = Var2Pla[v];
  if (p < iVar4) {
    __assert_fail("Var2Pla[v] <= p",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifDec08.c"
                  ,0xf4,"void If_Dec08MoveTo(word *, int, int, int, int *, int *)");
  }
  uVar11 = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    uVar11 = 1;
  }
  bVar9 = false;
  uVar8 = 0;
  if (0 < (int)uVar11) {
    uVar8 = (ulong)uVar11;
  }
  pwVar3 = pG;
  pIn = pF;
  while (pwVar7 = pwVar3, iVar4 != p) {
    if (nVars + -1 <= iVar4) {
      __assert_fail("iVar < nVars - 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifDec08.c"
                    ,0xcf,"void If_Dec08SwapAdjacent(word *, word *, int, int)");
    }
    if (iVar4 < 5) {
      for (uVar10 = 0; uVar8 != uVar10; uVar10 = uVar10 + 1) {
        uVar2 = pIn[uVar10];
        bVar6 = (byte)(1 << ((byte)iVar4 & 0x1f));
        pwVar7[uVar10] =
             (uVar2 & PMasks[iVar4][2]) >> (bVar6 & 0x3f) |
             (PMasks[iVar4][1] & uVar2) << (bVar6 & 0x3f) | PMasks[iVar4][0] & uVar2;
      }
    }
    else if (iVar4 == 5) {
      for (lVar5 = 0; lVar5 < (int)uVar11; lVar5 = lVar5 + 2) {
        uVar10 = pIn[lVar5];
        uVar2 = pIn[lVar5 + 1];
        pwVar7[lVar5] = uVar2 << 0x20 | uVar10 & 0xffffffff;
        pwVar7[lVar5 + 1] = uVar10 >> 0x20 | uVar2 & 0xffffffff00000000;
      }
    }
    else {
      for (lVar5 = 0; (int)lVar5 < (int)uVar11; lVar5 = lVar5 + 4) {
        pwVar7[lVar5] = pIn[lVar5];
        auVar1 = *(undefined1 (*) [16])(pIn + lVar5 + 1);
        auVar12._0_8_ = auVar1._8_8_;
        auVar12._8_4_ = auVar1._0_4_;
        auVar12._12_4_ = auVar1._4_4_;
        *(undefined1 (*) [16])(pwVar7 + lVar5 + 1) = auVar12;
        pwVar7[lVar5 + 3] = pIn[lVar5 + 3];
      }
    }
    Var2Pla[Pla2Var[iVar4]] = Var2Pla[Pla2Var[iVar4]] + 1;
    Var2Pla[Pla2Var[(long)iVar4 + 1]] = Var2Pla[Pla2Var[(long)iVar4 + 1]] + -1;
    *(ulong *)(Pla2Var + iVar4) =
         CONCAT44((int)*(undefined8 *)(Pla2Var + iVar4),
                  (int)((ulong)*(undefined8 *)(Pla2Var + iVar4) >> 0x20));
    bVar9 = (bool)(bVar9 ^ 1);
    pwVar3 = pIn;
    pIn = pwVar7;
    iVar4 = Var2Pla[v];
  }
  if (bVar9) {
    If_Dec08Copy(pF,pIn,nVars);
  }
  if (Pla2Var[(uint)p] == v) {
    return;
  }
  __assert_fail("Pla2Var[p] == v",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifDec08.c"
                ,0x104,"void If_Dec08MoveTo(word *, int, int, int, int *, int *)");
}

Assistant:

static inline void If_Dec08MoveTo( word * pF, int nVars, int v, int p, int Pla2Var[], int Var2Pla[] )
{
    word pG[16], * pIn = pF, * pOut = pG, * pTemp;
    int iPlace0, iPlace1, Count = 0;
    assert( Var2Pla[v] <= p );
    while ( Var2Pla[v] != p )
    {
        iPlace0 = Var2Pla[v];
        iPlace1 = Var2Pla[v]+1;
        If_Dec08SwapAdjacent( pOut, pIn, iPlace0, nVars );
        pTemp = pIn; pIn = pOut, pOut = pTemp;
        Var2Pla[Pla2Var[iPlace0]]++;
        Var2Pla[Pla2Var[iPlace1]]--;
        Pla2Var[iPlace0] ^= Pla2Var[iPlace1];
        Pla2Var[iPlace1] ^= Pla2Var[iPlace0];
        Pla2Var[iPlace0] ^= Pla2Var[iPlace1];
        Count++;
    }
    if ( Count & 1 )
        If_Dec08Copy( pF, pIn, nVars );
    assert( Pla2Var[p] == v );
}